

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::learn(memory_tree *b,single_learner *base,example *ec)

{
  example **ppeVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ostream *poVar5;
  clock_t cVar6;
  clock_t cVar7;
  uint uVar8;
  double dVar9;
  example *new_ec;
  uint32_t local_3c;
  example *local_38;
  
  iVar4 = b->iter + 1;
  b->iter = iVar4;
  if (b->test_mode == false) {
    predict(b,base,ec);
    if ((b->iter * 0x3afb7e91 + 0x346dc0U >> 3 | b->iter * 0x20000000) < 0xd1b71) {
      iVar4 = b->oas;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"at iter ",8);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,b->iter);
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", top(",6);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,b->top_K);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") pred error: ",0xe);
        poVar5 = std::ostream::_M_insert<double>((double)b->num_mistakes / (double)b->iter);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,", total num queires so far: ",0x1c);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", max depth: ",0xd);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", max exp in leaf: ",0x13);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", avg hamming loss: ",0x14);
        poVar5 = std::ostream::_M_insert<double>((double)b->hamming_loss / (double)b->iter);
      }
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    cVar6 = clock();
    if (b->current_pass == 0) {
      local_38 = calloc_or_throw<example>(1);
      copy_example_data(local_38,ec,b->oas);
      v_array<example_*>::push_back(&b->examples,&local_38);
      if (b->online == 1) {
        ppeVar1 = (b->examples)._end;
        local_3c = (int)((ulong)((long)ppeVar1 - (long)(b->examples)._begin) >> 3) - 1;
        single_query_and_learn(b,base,&local_3c,ppeVar1[-1]);
      }
      local_3c = (int)((ulong)((long)(b->examples)._end - (long)(b->examples)._begin) >> 3) - 1;
      uVar8 = 0;
      insert_example(b,base,&local_3c,false);
      if (b->dream_repeats != 0) {
        do {
          experience_replay(b,base);
          uVar8 = uVar8 + 1;
        } while (uVar8 < b->dream_repeats);
      }
    }
    else {
      ppeVar1 = (b->examples)._begin;
      uVar8 = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(b->examples)._end - (long)ppeVar1 >> 3;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)b->iter;
      local_38 = (example *)CONCAT44(local_38._4_4_,SUB164(auVar3 % auVar2,0));
      single_query_and_learn(b,base,(uint32_t *)&local_38,ppeVar1[SUB168(auVar3 % auVar2,0)]);
      if (b->dream_repeats != 0) {
        do {
          experience_replay(b,base);
          uVar8 = uVar8 + 1;
        } while (uVar8 < b->dream_repeats);
      }
    }
    cVar7 = clock();
    b->construct_time = (float)((double)b->construct_time + (double)(cVar7 - cVar6) / 1000000.0);
  }
  else {
    if ((iVar4 * 0x3afb7e91 + 0x346dc0U >> 3 | iVar4 * 0x20000000) < 0xd1b71) {
      iVar4 = b->oas;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"at iter ",8);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,b->iter);
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", pred error: ",0xe);
        dVar9 = (double)b->num_mistakes;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", avg hamming loss: ",0x14);
        dVar9 = (double)b->hamming_loss;
      }
      poVar5 = std::ostream::_M_insert<double>(dVar9 / (double)b->iter);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    cVar6 = clock();
    predict(b,base,ec);
    cVar7 = clock();
    b->test_time = (float)((double)b->test_time + (double)(cVar7 - cVar6) / 1000000.0);
  }
  return;
}

Assistant:

void learn(memory_tree& b, single_learner& base, example& ec)
    {        
        if (b.test_mode == false){
            b.iter++;
            predict(b, base, ec);
            
            if (b.iter%5000 == 0){
                if (b.oas == false)
	                cout<<"at iter "<<b.iter<<", top("<<b.top_K<<") pred error: "<<b.num_mistakes*1./b.iter<<", total num queires so far: "<<b.total_num_queries<<", max depth: "<<b.max_depth<<", max exp in leaf: "<<b.max_ex_in_leaf<<endl;
                else
                    cout<<"at iter "<<b.iter<<", avg hamming loss: "<<b.hamming_loss*1./b.iter<<endl;
            }

            clock_t begin = clock();
        
            if (b.current_pass < 1){ //in the first pass, we need to store the memory:
                example* new_ec = &calloc_or_throw<example>();
                copy_example_data(new_ec, &ec, b.oas);
                b.examples.push_back(new_ec);   
                if(b.online == true)
                    update_rew(b, base, b.examples.size() - 1,*b.examples[b.examples.size()-1]); //query and learn
                
                insert_example(b, base, b.examples.size() - 1); //unsupervised learning. 
                for (uint32_t i = 0; i < b.dream_repeats; i++)
                    experience_replay(b, base);
            }
            else{ //starting from the current pass, we just learn using reinforcement signal, no insertion needed:
                size_t ec_id = (b.iter)%b.examples.size();
                update_rew(b, base, ec_id, *b.examples[ec_id]); //no insertion will happen in this call
		        for (uint32_t i = 0; i < b.dream_repeats; i++)
		            experience_replay(b, base);
            }
            b.construct_time += double(clock() - begin)/CLOCKS_PER_SEC;   
        }
        else if (b.test_mode == true){
            b.iter++;
            if (b.iter % 5000 == 0){
                if(b.oas == false)
                    cout<<"at iter "<<b.iter<<", pred error: "<<b.num_mistakes*1./b.iter<<endl;
                else
                    cout<<"at iter "<<b.iter<<", avg hamming loss: "<<b.hamming_loss*1./b.iter<<endl;
            }
            clock_t begin = clock();
            predict(b, base, ec);
            b.test_time += double(clock() - begin)/CLOCKS_PER_SEC;
        }

    }